

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprk.c
# Opt level: O1

ARKodeSPRKTable arkodeSymplecticSofroniou10(void)

{
  double *pdVar1;
  sunrealtype *psVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  ARKodeSPRKTable pAVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  
  pAVar6 = ARKodeSPRKTable_Alloc(0x24);
  if (pAVar6 == (ARKodeSPRKTable)0x0) {
    pAVar6 = (ARKodeSPRKTable)0x0;
  }
  else {
    pAVar6->q = 10;
    pAVar6->stages = 0x24;
    pdVar1 = pAVar6->a;
    *pdVar1 = 0.07879572252168641;
    pdVar1[1] = 0.3130961034151085;
    pdVar1[2] = 0.027918383235078066;
    pdVar1[3] = -0.22959284159390708;
    pdVar1[4] = 0.13096206107716488;
    pdVar1[5] = -0.2697334056545107;
    pdVar1[6] = 0.07497334315589144;
    pdVar1[7] = 0.1119934239998102;
    pdVar1[8] = 0.36613344954622673;
    pdVar1[9] = -0.3991056301360359;
    pdVar1[10] = 0.10308739852747108;
    pdVar1[0xb] = 0.41143087395589023;
    pdVar1[0xc] = -0.0048663605831352616;
    pdVar1[0xd] = -0.3920333537086399;
    pdVar1[0xe] = 0.05194250296244965;
    pdVar1[0xf] = 0.050665090759924494;
    pdVar1[0x10] = 0.049674370639729876;
    pdVar1[0x11] = 0.049317735759594535;
    pdVar1[0x12] = 0.049674370639729876;
    pdVar1[0x13] = 0.050665090759924494;
    pdVar1[0x14] = 0.05194250296244965;
    pdVar1[0x15] = -0.3920333537086399;
    pdVar1[0x16] = -0.0048663605831352616;
    pdVar1[0x17] = 0.41143087395589023;
    pdVar1[0x18] = 0.10308739852747108;
    pdVar1[0x19] = -0.3991056301360359;
    pdVar1[0x1a] = 0.36613344954622673;
    pdVar1[0x1b] = 0.1119934239998102;
    pdVar1[0x1c] = 0.07497334315589144;
    pdVar1[0x1d] = -0.2697334056545107;
    pdVar1[0x1e] = 0.13096206107716488;
    pdVar1[0x1f] = -0.22959284159390708;
    pdVar1[0x20] = 0.027918383235078066;
    pdVar1[0x21] = 0.3130961034151085;
    pdVar1[0x22] = 0.07879572252168641;
    pdVar1[0x23] = 0.0;
    psVar2 = pAVar6->ahat;
    *psVar2 = 0.03939786126084321;
    dVar3 = (*pdVar1 + pdVar1[1]) * 0.5;
    psVar2[1] = dVar3;
    dVar4 = (pdVar1[1] + pdVar1[2]) * 0.5;
    psVar2[2] = dVar4;
    dVar8 = (pdVar1[2] + pdVar1[3]) * 0.5;
    psVar2[3] = dVar8;
    dVar9 = (pdVar1[3] + pdVar1[4]) * 0.5;
    psVar2[4] = dVar9;
    dVar10 = (pdVar1[4] + pdVar1[5]) * 0.5;
    psVar2[5] = dVar10;
    dVar11 = (pdVar1[5] + pdVar1[6]) * 0.5;
    psVar2[6] = dVar11;
    dVar12 = (pdVar1[6] + pdVar1[7]) * 0.5;
    psVar2[7] = dVar12;
    dVar13 = (pdVar1[7] + pdVar1[8]) * 0.5;
    psVar2[8] = dVar13;
    dVar14 = (pdVar1[8] + pdVar1[9]) * 0.5;
    psVar2[9] = dVar14;
    dVar15 = (pdVar1[9] + pdVar1[10]) * 0.5;
    psVar2[10] = dVar15;
    dVar16 = (pdVar1[10] + pdVar1[0xb]) * 0.5;
    psVar2[0xb] = dVar16;
    dVar17 = (pdVar1[0xb] + pdVar1[0xc]) * 0.5;
    psVar2[0xc] = dVar17;
    dVar18 = (pdVar1[0xc] + pdVar1[0xd]) * 0.5;
    psVar2[0xd] = dVar18;
    dVar19 = (pdVar1[0xd] + pdVar1[0xe]) * 0.5;
    psVar2[0xe] = dVar19;
    dVar20 = (pdVar1[0xe] + pdVar1[0xf]) * 0.5;
    psVar2[0xf] = dVar20;
    dVar7 = (pdVar1[0xf] + pdVar1[0x10]) * 0.5;
    psVar2[0x10] = dVar7;
    dVar5 = (pdVar1[0x10] + pdVar1[0x11]) * 0.5;
    psVar2[0x11] = dVar5;
    psVar2[0x12] = dVar5;
    psVar2[0x13] = dVar7;
    psVar2[0x14] = dVar20;
    psVar2[0x15] = dVar19;
    psVar2[0x16] = dVar18;
    psVar2[0x17] = dVar17;
    psVar2[0x18] = dVar16;
    psVar2[0x19] = dVar15;
    psVar2[0x1a] = dVar14;
    psVar2[0x1b] = dVar13;
    psVar2[0x1c] = dVar12;
    psVar2[0x1d] = dVar11;
    psVar2[0x1e] = dVar10;
    psVar2[0x1f] = dVar9;
    psVar2[0x20] = dVar8;
    psVar2[0x21] = dVar4;
    psVar2[0x22] = dVar3;
    psVar2[0x23] = 0.03939786126084321;
  }
  return pAVar6;
}

Assistant:

static ARKodeSPRKTable arkodeSymplecticSofroniou10(void)
{
  ARKodeSPRKTable sprk_table = ARKodeSPRKTable_Alloc(36);
  if (!sprk_table) { return NULL; }
  sprk_table->q      = 10;
  sprk_table->stages = 36;

  sprk_table->a[0]    = SUN_RCONST(0.078795722521686419263907679337684);
  sprk_table->a[1]    = SUN_RCONST(0.31309610341510852776481247192647);
  sprk_table->a[2]    = SUN_RCONST(0.027918383235078066109520273275299);
  sprk_table->a[3]    = -SUN_RCONST(0.22959284159390709415121339679655);
  sprk_table->a[4]    = SUN_RCONST(0.13096206107716486317465685927961);
  sprk_table->a[5]    = -SUN_RCONST(0.26973340565451071434460973222411);
  sprk_table->a[6]    = SUN_RCONST(0.074973343155891435666137105641410);
  sprk_table->a[7]    = SUN_RCONST(0.11199342399981020488957508073640);
  sprk_table->a[8]    = SUN_RCONST(0.36613344954622675119314812353150);
  sprk_table->a[9]    = -SUN_RCONST(0.39910563013603589787862981058340);
  sprk_table->a[10]   = SUN_RCONST(0.10308739852747107731580277001372);
  sprk_table->a[11]   = SUN_RCONST(0.41143087395589023782070411897608);
  sprk_table->a[12]   = -SUN_RCONST(0.0048663605831352617621956593099771);
  sprk_table->a[13]   = -SUN_RCONST(0.39203335370863990644808193642610);
  sprk_table->a[14]   = SUN_RCONST(0.051942502962449647037182904015976);
  sprk_table->a[15]   = SUN_RCONST(0.050665090759924496335874344156866);
  sprk_table->a[16]   = SUN_RCONST(0.049674370639729879054568800279461);
  sprk_table->a[17]   = SUN_RCONST(0.049317735759594537917680008339338);
  sprk_table->a[18]   = sprk_table->a[16];
  sprk_table->a[19]   = sprk_table->a[15];
  sprk_table->a[20]   = sprk_table->a[14];
  sprk_table->a[21]   = sprk_table->a[13];
  sprk_table->a[22]   = sprk_table->a[12];
  sprk_table->a[23]   = sprk_table->a[11];
  sprk_table->a[24]   = sprk_table->a[10];
  sprk_table->a[25]   = sprk_table->a[9];
  sprk_table->a[26]   = sprk_table->a[8];
  sprk_table->a[27]   = sprk_table->a[7];
  sprk_table->a[28]   = sprk_table->a[6];
  sprk_table->a[29]   = sprk_table->a[5];
  sprk_table->a[30]   = sprk_table->a[4];
  sprk_table->a[31]   = sprk_table->a[3];
  sprk_table->a[32]   = sprk_table->a[2];
  sprk_table->a[33]   = sprk_table->a[1];
  sprk_table->a[34]   = sprk_table->a[0];
  sprk_table->a[35]   = SUN_RCONST(0.0);
  sprk_table->ahat[0] = sprk_table->a[0] / SUN_RCONST(2.0);
  sprk_table->ahat[1] = (sprk_table->a[0] + sprk_table->a[1]) / SUN_RCONST(2.0);
  sprk_table->ahat[2] = (sprk_table->a[1] + sprk_table->a[2]) / SUN_RCONST(2.0);
  sprk_table->ahat[3] = (sprk_table->a[2] + sprk_table->a[3]) / SUN_RCONST(2.0);
  sprk_table->ahat[4] = (sprk_table->a[3] + sprk_table->a[4]) / SUN_RCONST(2.0);
  sprk_table->ahat[5] = (sprk_table->a[4] + sprk_table->a[5]) / SUN_RCONST(2.0);
  sprk_table->ahat[6] = (sprk_table->a[5] + sprk_table->a[6]) / SUN_RCONST(2.0);
  sprk_table->ahat[7] = (sprk_table->a[6] + sprk_table->a[7]) / SUN_RCONST(2.0);
  sprk_table->ahat[8] = (sprk_table->a[7] + sprk_table->a[8]) / SUN_RCONST(2.0);
  sprk_table->ahat[9] = (sprk_table->a[8] + sprk_table->a[9]) / SUN_RCONST(2.0);
  sprk_table->ahat[10] = (sprk_table->a[9] + sprk_table->a[10]) / SUN_RCONST(2.0);
  sprk_table->ahat[11] = (sprk_table->a[10] + sprk_table->a[11]) /
                         SUN_RCONST(2.0);
  sprk_table->ahat[12] = (sprk_table->a[11] + sprk_table->a[12]) /
                         SUN_RCONST(2.0);
  sprk_table->ahat[13] = (sprk_table->a[12] + sprk_table->a[13]) /
                         SUN_RCONST(2.0);
  sprk_table->ahat[14] = (sprk_table->a[13] + sprk_table->a[14]) /
                         SUN_RCONST(2.0);
  sprk_table->ahat[15] = (sprk_table->a[14] + sprk_table->a[15]) /
                         SUN_RCONST(2.0);
  sprk_table->ahat[16] = (sprk_table->a[15] + sprk_table->a[16]) /
                         SUN_RCONST(2.0);
  sprk_table->ahat[17] = (sprk_table->a[16] + sprk_table->a[17]) /
                         SUN_RCONST(2.0);
  sprk_table->ahat[18] = sprk_table->ahat[17];
  sprk_table->ahat[19] = sprk_table->ahat[16];
  sprk_table->ahat[20] = sprk_table->ahat[15];
  sprk_table->ahat[21] = sprk_table->ahat[14];
  sprk_table->ahat[22] = sprk_table->ahat[13];
  sprk_table->ahat[23] = sprk_table->ahat[12];
  sprk_table->ahat[24] = sprk_table->ahat[11];
  sprk_table->ahat[25] = sprk_table->ahat[10];
  sprk_table->ahat[26] = sprk_table->ahat[9];
  sprk_table->ahat[27] = sprk_table->ahat[8];
  sprk_table->ahat[28] = sprk_table->ahat[7];
  sprk_table->ahat[29] = sprk_table->ahat[6];
  sprk_table->ahat[30] = sprk_table->ahat[5];
  sprk_table->ahat[31] = sprk_table->ahat[4];
  sprk_table->ahat[32] = sprk_table->ahat[3];
  sprk_table->ahat[33] = sprk_table->ahat[2];
  sprk_table->ahat[34] = sprk_table->ahat[1];
  sprk_table->ahat[35] = sprk_table->ahat[0];

  return sprk_table;
}